

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O3

void de::createDirectory(char *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  runtime_error *this;
  FilePath parentPath;
  FilePath dirPath;
  FilePath local_78;
  string local_58;
  FilePath local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,path,(allocator<char> *)&local_58);
  FilePath::normalize(&local_38,&local_78);
  paVar1 = &local_78.m_path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_path._M_dataplus._M_p,
                    local_78.m_path.field_2._M_allocated_capacity + 1);
  }
  FilePath::getDirName_abi_cxx11_(&local_58,&local_38);
  local_78.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_58._M_dataplus._M_p,
             local_58._M_dataplus._M_p + local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  bVar2 = FilePath::exists(&local_38);
  if (bVar2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Destination exists already");
  }
  else {
    bVar2 = FilePath::exists(&local_78);
    if (bVar2) {
      TVar3 = FilePath::getType(&local_78);
      if (TVar3 == TYPE_DIRECTORY) {
        iVar4 = mkdir(path,0x1ff);
        if (iVar4 == 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.m_path._M_dataplus._M_p != paVar1) {
            operator_delete(local_78.m_path._M_dataplus._M_p,
                            local_78.m_path.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38.m_path._M_dataplus._M_p != &local_38.m_path.field_2) {
            operator_delete(local_38.m_path._M_dataplus._M_p,
                            local_38.m_path.field_2._M_allocated_capacity + 1);
          }
          return;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Failed to create directory");
      }
      else {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Parent is not directory");
      }
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Parent directory doesn\'t exist");
    }
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void createDirectory (const char* path)
{
	FilePath	dirPath		= FilePath::normalize(path);
	FilePath	parentPath	(dirPath.getDirName());

	if (dirPath.exists())
		throw std::runtime_error("Destination exists already");
	else if (!parentPath.exists())
		throw std::runtime_error("Parent directory doesn't exist");
	else if (parentPath.getType() != FilePath::TYPE_DIRECTORY)
		throw std::runtime_error("Parent is not directory");

	createDirectoryImpl(path);
}